

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::FinishCommandList
          (DeviceContextVkImpl *this,ICommandList **ppCommandList)

{
  VkResult VVar1;
  CommandListVkImpl *this_00;
  string msg;
  VkCommandBuffer vkCmdBuff;
  undefined1 local_50 [24];
  char *local_38;
  undefined4 local_30;
  VkCommandBuffer local_28;
  DeviceContextVkImpl *local_20;
  
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == false) {
    FormatString<char[46]>
              ((string *)local_50,(char (*) [46])"Only deferred context can record command list");
    DebugAssertionFailed
              ((Char *)local_50._0_8_,"FinishCommandList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb0b);
    std::__cxx11::string::~string((string *)local_50);
  }
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0) {
    FormatString<char[53]>
              ((string *)local_50,
               (char (*) [53])"Finishing command list inside an active render pass.");
    DebugAssertionFailed
              ((Char *)local_50._0_8_,"FinishCommandList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb0c);
    std::__cxx11::string::~string((string *)local_50);
  }
  EndRenderScope(this);
  local_28 = (this->m_CommandBuffer).m_VkCmdBuffer;
  VVar1 = (*vkEndCommandBuffer)(local_28);
  if (VVar1 != VK_SUCCESS) {
    FormatString<char[29]>((string *)local_50,(char (*) [29])"Failed to end command buffer");
    DebugAssertionFailed
              ((Char *)local_50._0_8_,"FinishCommandList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb12);
    std::__cxx11::string::~string((string *)local_50);
  }
  local_50._0_8_ = &this->m_CmdListAllocator;
  local_50._8_8_ = 0;
  local_50._16_8_ = "CommandListVkImpl instance";
  local_38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
  ;
  local_30 = 0xb15;
  local_20 = this;
  this_00 = MakeNewRCObj<Diligent::CommandListVkImpl,Diligent::FixedBlockMemoryAllocator>::
            operator()((MakeNewRCObj<Diligent::CommandListVkImpl,Diligent::FixedBlockMemoryAllocator>
                        *)local_50,
                       &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice,&local_20,
                       &local_28);
  CommandListBase<Diligent::EngineVkImplTraits>::QueryInterface
            (&this_00->super_CommandListBase<Diligent::EngineVkImplTraits>,
             (INTERFACE_ID *)IID_CommandList,(IObject **)ppCommandList);
  VulkanUtilities::VulkanCommandBuffer::Reset(&this->m_CommandBuffer);
  (this->m_State).CommittedVBsUpToDate = false;
  (this->m_State).CommittedIBUpToDate = false;
  (this->m_State).ShadingRateIsSet = false;
  (this->m_State).NullRenderTargets = false;
  (this->m_State).NumCommands = 0;
  (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_MAX_ENUM;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator=
            (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState,
             (PipelineStateVkImpl *)0x0);
  this->m_pQueryMgr = (QueryManagerVk *)0x0;
  InvalidateState(this);
  DeviceContextBase<Diligent::EngineVkImplTraits>::FinishCommandList
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  return;
}

Assistant:

void DeviceContextVkImpl::FinishCommandList(ICommandList** ppCommandList)
{
    DEV_CHECK_ERR(IsDeferred(), "Only deferred context can record command list");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "Finishing command list inside an active render pass.");

    EndRenderScope();

    VkCommandBuffer vkCmdBuff = m_CommandBuffer.GetVkCmdBuffer();
    VkResult        err       = vkEndCommandBuffer(vkCmdBuff);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to end command buffer");
    (void)err;

    CommandListVkImpl* pCmdListVk{NEW_RC_OBJ(m_CmdListAllocator, "CommandListVkImpl instance", CommandListVkImpl)(m_pDevice, this, vkCmdBuff)};
    pCmdListVk->QueryInterface(IID_CommandList, reinterpret_cast<IObject**>(ppCommandList));

    m_CommandBuffer.Reset();
    m_State          = ContextState{};
    m_pPipelineState = nullptr;
    m_pQueryMgr      = nullptr;

    InvalidateState();

    TDeviceContextBase::FinishCommandList();
}